

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManGraphListExtract(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Nwk_Vrt_t **ppNVar4;
  long lVar5;
  
  uVar1 = pVertex->nEdges;
  lVar5 = (long)(int)uVar1;
  if (lVar5 < 1) {
    __assert_fail("pVertex->nEdges > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                  ,0xf6,"void Nwk_ManGraphListExtract(Nwk_Grf_t *, Nwk_Vrt_t *)");
  }
  if (uVar1 == 1) {
    ppNVar4 = p->pVerts;
    lVar5 = (long)ppNVar4[pVertex[1].Id]->nEdges;
    if (lVar5 < 0x10) {
      if (p->pLists1[lVar5] == 0) goto LAB_0049cc4d;
      iVar2 = pVertex->iPrev;
      iVar3 = pVertex->iNext;
      if ((long)iVar2 != 0) {
        ppNVar4[iVar2]->iNext = iVar3;
      }
      if (iVar3 != 0) {
        ppNVar4[iVar3]->iPrev = iVar2;
      }
      if (p->pLists1[lVar5] == pVertex->Id) {
        p->pLists1[lVar5] = iVar3;
      }
    }
    else {
      if (p->pLists1[0x10] == 0) {
LAB_0049cc4d:
        __assert_fail("*pList",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0xb7,"void Nwk_ManGraphListDelete(Nwk_Grf_t *, int *, Nwk_Vrt_t *)");
      }
      iVar2 = pVertex->iPrev;
      iVar3 = pVertex->iNext;
      if ((long)iVar2 != 0) {
        ppNVar4[iVar2]->iNext = iVar3;
      }
      if (iVar3 != 0) {
        ppNVar4[iVar3]->iPrev = iVar2;
      }
      if (p->pLists1[0x10] == pVertex->Id) {
        p->pLists1[0x10] = iVar3;
      }
    }
  }
  else if (uVar1 < 0x10) {
    if (p->pLists2[lVar5] == 0) goto LAB_0049cc4d;
    iVar2 = pVertex->iPrev;
    iVar3 = pVertex->iNext;
    if ((long)iVar2 != 0) {
      p->pVerts[iVar2]->iNext = iVar3;
    }
    if (iVar3 != 0) {
      p->pVerts[iVar3]->iPrev = iVar2;
    }
    if (p->pLists2[lVar5] == pVertex->Id) {
      p->pLists2[lVar5] = iVar3;
    }
  }
  else {
    if (p->pLists2[0x10] == 0) goto LAB_0049cc4d;
    iVar2 = pVertex->iPrev;
    iVar3 = pVertex->iNext;
    if ((long)iVar2 != 0) {
      p->pVerts[iVar2]->iNext = iVar3;
    }
    if (iVar3 != 0) {
      p->pVerts[iVar3]->iPrev = iVar2;
    }
    if (p->pLists2[0x10] == pVertex->Id) {
      p->pLists2[0x10] = iVar3;
    }
  }
  pVertex->iNext = 0;
  pVertex->iPrev = 0;
  return;
}

Assistant:

static inline void Nwk_ManGraphListExtract( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex )
{
    Nwk_Vrt_t * pNext;
    assert( pVertex->nEdges > 0 );

    if ( pVertex->nEdges == 1 )
    {
        pNext = p->pVerts[ pVertex->pEdges[0] ];
        if ( pNext->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists1 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists1 + pNext->nEdges, pVertex );
    }
    else
    {
        if ( pVertex->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists2 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists2 + pVertex->nEdges, pVertex );
    }
}